

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O2

void removeFd(Sockets *sockets,curl_socket_t fd,int mention)

{
  curl_socket_t *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (mention != 0) {
    fprintf(_stderr,"Remove socket fd %d\n",fd);
  }
  iVar3 = sockets->count;
  iVar4 = -1;
  for (lVar5 = 0; lVar5 < iVar3; lVar5 = lVar5 + 1) {
    pcVar1 = sockets->sockets;
    if (pcVar1[lVar5] == fd) {
      iVar2 = iVar3 + -1;
      if (lVar5 < iVar3 + -1) {
        memmove(pcVar1 + lVar5,pcVar1 + lVar5 + 1,(long)(iVar3 + iVar4) << 2);
        iVar2 = sockets->count + -1;
      }
      iVar3 = iVar2;
      sockets->count = iVar3;
    }
    iVar4 = iVar4 + -1;
  }
  return;
}

Assistant:

static void removeFd(struct Sockets* sockets, curl_socket_t fd, int mention)
{
  int i;

  if(mention)
    fprintf(stderr, "Remove socket fd %d\n", (int) fd);

  for (i = 0; i < sockets->count; ++i) {
    if (sockets->sockets[i] == fd) {
      if (i < sockets->count - 1)
        memmove(&sockets->sockets[i], &sockets->sockets[i + 1],
              sizeof(curl_socket_t) * (sockets->count - (i + 1)));
      --sockets->count;
    }
  }
}